

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model
          (raw_quasi_adaptive_huffman_data_model *this,bool encoding,uint total_syms,
          bool fast_updating,bool use_polar_codes)

{
  int in_EDX;
  byte in_SIL;
  raw_quasi_adaptive_huffman_data_model *in_RDI;
  
  vector<unsigned_short>::vector(&in_RDI->m_sym_freq);
  vector<unsigned_short>::vector(&in_RDI->m_codes);
  vector<unsigned_char>::vector(&in_RDI->m_code_sizes);
  in_RDI->m_pDecode_tables = (decoder_tables *)0x0;
  in_RDI->m_total_syms = 0;
  in_RDI->m_max_cycle = 0;
  in_RDI->m_update_cycle = 0;
  in_RDI->m_symbols_until_update = 0;
  in_RDI->m_total_count = 0;
  in_RDI->m_decoder_table_bits = '\0';
  in_RDI->m_encoding = (bool)(in_SIL & 1);
  in_RDI->m_fast_updating = false;
  in_RDI->m_use_polar_codes = false;
  if (in_EDX != 0) {
    init(in_RDI,(EVP_PKEY_CTX *)(ulong)(in_SIL & 1));
  }
  return;
}

Assistant:

raw_quasi_adaptive_huffman_data_model::raw_quasi_adaptive_huffman_data_model(bool encoding, uint total_syms, bool fast_updating, bool use_polar_codes) :
      m_pDecode_tables(NULL),
      m_total_syms(0),
      m_max_cycle(0),
      m_update_cycle(0),
      m_symbols_until_update(0),
      m_total_count(0),
      m_decoder_table_bits(0),
      m_encoding(encoding),
      m_fast_updating(false),
      m_use_polar_codes(false)
   {
      if (total_syms)
      {
         init(encoding, total_syms, fast_updating, use_polar_codes);
      }
   }